

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O1

string * anon_unknown.dwarf_b30d86::IndentText
                   (string *__return_storage_ptr__,string *text,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  string *psVar6;
  cmake *pcVar7;
  string_view arg;
  string_view arg_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view separator;
  string context;
  string indent;
  string local_e0;
  undefined8 local_c0;
  char *local_b8;
  string local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CMAKE_MESSAGE_INDENT","");
  psVar6 = cmMakefile::GetSafeDefinition(mf,&local_e0);
  arg._M_str = (psVar6->_M_dataplus)._M_p;
  arg._M_len = psVar6->_M_string_length;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_70,arg,false);
  cmJoin((string *)&local_50,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&local_70,(string_view)(ZEXT816(0x81ca45) << 0x40),(string_view)ZEXT816(0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = cmMakefile::GetCMakeInstance(mf);
  bVar2 = pcVar7->LogContext;
  bVar5 = true;
  if (bVar2 == false) {
    local_70._M_allocated_capacity = (size_type)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CMAKE_MESSAGE_CONTEXT_SHOW","");
    bVar5 = cmMakefile::IsOn(mf,(string *)&local_70);
  }
  paVar1 = &local_e0.field_2;
  if ((bVar2 == false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60)) {
    operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
  }
  if (bVar5 != false) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CMAKE_MESSAGE_CONTEXT","");
    psVar6 = cmMakefile::GetSafeDefinition(mf,&local_e0);
    arg_00._M_str = (psVar6->_M_dataplus)._M_p;
    arg_00._M_len = psVar6->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90,arg_00,false);
    separator._M_str = ".";
    separator._M_len = 1;
    cmJoin(&local_b0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_90,separator,(string_view)ZEXT816(0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0._M_string_length != 0) {
      local_e0._M_dataplus._M_p = &DAT_00000001;
      local_e0._M_string_length = 0x7f5e1c;
      local_e0.field_2._M_allocated_capacity = local_b0._M_string_length;
      local_e0.field_2._8_8_ = local_b0._M_dataplus._M_p;
      local_c0 = 2;
      local_b8 = "] ";
      views._M_len = 3;
      views._M_array = (iterator)&local_e0;
      cmCatViews_abi_cxx11_((string *)local_90,views);
      std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,local_90._0_8_);
      if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_50._8_8_ != 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"\n","");
    std::operator+(&local_b0,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    cmsys::SystemTools::ReplaceString(text,&local_e0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::replace((ulong)text,0,(char *)0x0,local_50._M_allocated_capacity);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (text->_M_dataplus)._M_p;
  paVar1 = &text->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&text->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = text->_M_string_length;
  (text->_M_dataplus)._M_p = (pointer)paVar1;
  text->_M_string_length = 0;
  (text->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IndentText(std::string text, cmMakefile& mf)
{
  auto indent =
    cmJoin(cmExpandedList(mf.GetSafeDefinition("CMAKE_MESSAGE_INDENT")), "");

  const auto showContext = mf.GetCMakeInstance()->GetShowLogContext() ||
    mf.IsOn("CMAKE_MESSAGE_CONTEXT_SHOW");
  if (showContext) {
    auto context = cmJoin(
      cmExpandedList(mf.GetSafeDefinition("CMAKE_MESSAGE_CONTEXT")), ".");
    if (!context.empty()) {
      indent.insert(0u, cmStrCat("["_s, context, "] "_s));
    }
  }

  if (!indent.empty()) {
    cmSystemTools::ReplaceString(text, "\n", "\n" + indent);
    text.insert(0u, indent);
  }
  return text;
}